

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void aom_highbd_blend_a64_mask_sse4_1
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               int subw,int subh,int bd)

{
  uint32_t in_ECX;
  uint8_t *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  uint8_t *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *dst;
  
  if (((in_stack_00000020 | in_stack_00000018) & 3) == 0) {
    (*aom_highbd_blend_a64_mask_sse4_1::blend[(int)(uint)(in_stack_00000038 == 0xc)]
      [(int)((int)in_stack_00000018 >> 2 & 1)][(int)(uint)(in_stack_00000028 != 0)]
      [(int)(uint)(in_stack_00000030 != 0)])
              ((uint16_t *)((long)in_RDI << 1),in_ESI,(uint16_t *)((long)in_RDX << 1),in_ECX,
               (uint16_t *)((long)in_R8 << 1),in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020);
  }
  else {
    aom_highbd_blend_a64_mask_c
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
               in_stack_00000038);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_mask_sse4_1(uint8_t *dst_8, uint32_t dst_stride,
                                      const uint8_t *src0_8,
                                      uint32_t src0_stride,
                                      const uint8_t *src1_8,
                                      uint32_t src1_stride, const uint8_t *mask,
                                      uint32_t mask_stride, int w, int h,
                                      int subw, int subh, int bd) {
  typedef void (*blend_fn)(
      uint16_t * dst, uint32_t dst_stride, const uint16_t *src0,
      uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
      const uint8_t *mask, uint32_t mask_stride, int w, int h);

  // Dimensions are: bd_index X width_index X subw X subh
  static const blend_fn blend[2][2][2][2] = {
    {   // bd == 8 or 10
      { // w % 8 == 0
        { blend_a64_mask_b10_w8n_sse4_1, blend_a64_mask_b10_sy_w8n_sse4_1 },
        { blend_a64_mask_b10_sx_w8n_sse4_1,
          blend_a64_mask_b10_sx_sy_w8n_sse4_1 } },
      { // w == 4
        { blend_a64_mask_b10_w4_sse4_1, blend_a64_mask_b10_sy_w4_sse4_1 },
        { blend_a64_mask_b10_sx_w4_sse4_1,
          blend_a64_mask_b10_sx_sy_w4_sse4_1 } } },
    {   // bd == 12
      { // w % 8 == 0
        { blend_a64_mask_b12_w8n_sse4_1, blend_a64_mask_b12_sy_w8n_sse4_1 },
        { blend_a64_mask_b12_sx_w8n_sse4_1,
          blend_a64_mask_b12_sx_sy_w8n_sse4_1 } },
      { // w == 4
        { blend_a64_mask_b12_w4_sse4_1, blend_a64_mask_b12_sy_w4_sse4_1 },
        { blend_a64_mask_b12_sx_w4_sse4_1,
          blend_a64_mask_b12_sx_sy_w4_sse4_1 } } }
  };

  assert(IMPLIES(src0_8 == dst_8, src0_stride == dst_stride));
  assert(IMPLIES(src1_8 == dst_8, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);
  if (UNLIKELY((h | w) & 3)) {  // if (w <= 2 || h <= 2)
    aom_highbd_blend_a64_mask_c(dst_8, dst_stride, src0_8, src0_stride, src1_8,
                                src1_stride, mask, mask_stride, w, h, subw,
                                subh, bd);
  } else {
    uint16_t *const dst = CONVERT_TO_SHORTPTR(dst_8);
    const uint16_t *const src0 = CONVERT_TO_SHORTPTR(src0_8);
    const uint16_t *const src1 = CONVERT_TO_SHORTPTR(src1_8);

    blend[bd == 12][(w >> 2) & 1][subw != 0][subh != 0](
        dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
        mask_stride, w, h);
  }
}